

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool redit_oshow(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  OBJ_INDEX_DATA *pOVar2;
  CHAR_DATA *in_RSI;
  char *in_RDI;
  int value;
  OBJ_INDEX_DATA *pObj;
  char *in_stack_00001410;
  CHAR_DATA *in_stack_00001418;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  if (*(char *)&in_RSI->next == '\0') {
    send_to_char(in_RDI,in_RSI);
  }
  else {
    bVar1 = is_number((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (bVar1) {
      bVar1 = is_number((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (bVar1) {
        atoi((char *)in_RSI);
        pOVar2 = get_obj_index((int)((ulong)in_RSI >> 0x20));
        if (pOVar2 == (OBJ_INDEX_DATA *)0x0) {
          send_to_char(in_RDI,in_RSI);
          return false;
        }
        *(OBJ_INDEX_DATA **)(*(long *)(in_RDI + 0x80) + 0x6c60) = pOVar2;
      }
      oedit_show(in_stack_00001418,in_stack_00001410);
      *(undefined8 *)(*(long *)(in_RDI + 0x80) + 0x6c60) = *(undefined8 *)(in_RDI + 0xa8);
    }
    else {
      send_to_char(in_RDI,in_RSI);
    }
  }
  return false;
}

Assistant:

bool redit_oshow(CHAR_DATA *ch, char *argument)
{
	OBJ_INDEX_DATA *pObj;
	int value;

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  oshow <vnum>\n\r", ch);
		return false;
	}

	if (!is_number(argument))
	{
		send_to_char("REdit: vnum has to be a number.\n\r", ch);
		return false;
	}

	if (is_number(argument))
	{
		value = atoi(argument);
		pObj = get_obj_index(value);
		if (!(pObj))
		{
			send_to_char("REdit:  That object does not exist.\n\r", ch);
			return false;
		}

		ch->desc->pEdit = (void *)pObj;
	}

	oedit_show(ch, argument);
	ch->desc->pEdit = (void *)ch->in_room;
	return false;
}